

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseGlobalModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  pointer *__ptr;
  Enum EVar3;
  _Head_base<0UL,_wabt::GlobalImport_*,_false> local_c8;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_c0;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_b8;
  ImportModuleField *local_b0;
  Location local_a8;
  string name;
  ModuleFieldList export_fields;
  Location loc;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar2 = Expect(this,Global);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  export_fields.size_ = 0;
  RVar2 = ParseInlineExports(this,&export_fields,Global);
  EVar3 = Error;
  if (RVar2.enum_ == Error) goto LAB_002416f9;
  bVar1 = PeekMatchLpar(this,Import);
  if (bVar1) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::GlobalImport,std::__cxx11::string&>((wabt *)&local_c8,&name);
    RVar2 = ParseInlineImport(this,(Import *)local_c8._M_head_impl);
    if ((RVar2.enum_ != Error) &&
       (RVar2 = ParseGlobalType(this,&(local_c8._M_head_impl)->global), RVar2.enum_ != Error)) {
      GetLocation(&local_a8,this);
      MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location>
                ((wabt *)&local_b0,
                 (unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)
                 &local_c8,&local_a8);
      local_b8._M_head_impl = local_b0;
      local_b0 = (ImportModuleField *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_b8);
      if (local_b8._M_head_impl != (ImportModuleField *)0x0) {
        (*((local_b8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_b8._M_head_impl = (ImportModuleField *)0x0;
      if (local_b0 != (ImportModuleField *)0x0) {
        (*(local_b0->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
          _vptr_ModuleField[1])();
      }
LAB_002416b9:
      if (local_c8._M_head_impl != (GlobalImport *)0x0) {
        (*((local_c8._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)3>).super_Import.
          _vptr_Import[1])();
      }
      anon_unknown_1::AppendInlineExportFields
                (module,&export_fields,
                 (int)((ulong)((long)(module->globals).
                                     super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(module->globals).
                                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
      RVar2 = Expect(this,Rpar);
      EVar3 = (Enum)(RVar2.enum_ == Error);
      goto LAB_002416f9;
    }
  }
  else {
    MakeUnique<wabt::GlobalModuleField,wabt::Location&,std::__cxx11::string&>
              ((wabt *)&local_a8,&loc,&name);
    RVar2 = ParseGlobalType(this,(Global *)
                                 ((long)&(((ImportMixin<(wabt::ExternalKind)3> *)
                                          local_a8.filename.data_)->super_Import).field_name.field_2
                                 + 8));
    local_c8._M_head_impl = (GlobalImport *)local_a8.filename.data_;
    if ((RVar2.enum_ != Error) &&
       (RVar2 = ParseTerminatingInstrList
                          (this,(ExprList *)
                                ((long)&(((Global *)((long)local_a8.filename.data_ + 0x50))->name).
                                        field_2 + 8)),
       local_c8._M_head_impl = (GlobalImport *)local_a8.filename.data_, RVar2.enum_ != Error)) {
      local_c0._M_head_impl = (GlobalModuleField *)local_a8.filename.data_;
      local_a8.filename.data_ = (char *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                                  *)&local_c0);
      if ((GlobalImport *)local_c0._M_head_impl != (GlobalImport *)0x0) {
        (*(((ImportMixin<(wabt::ExternalKind)3> *)
           &(local_c0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>)->super_Import
          )._vptr_Import[1])();
      }
      local_c0._M_head_impl = (GlobalModuleField *)0x0;
      local_c8._M_head_impl = (GlobalImport *)local_a8.filename.data_;
      goto LAB_002416b9;
    }
  }
  if (local_c8._M_head_impl != (GlobalImport *)0x0) {
    (*((local_c8._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)3>).super_Import._vptr_Import
      [1])();
  }
LAB_002416f9:
  intrusive_list<wabt::ModuleField>::clear(&export_fields);
  std::__cxx11::string::_M_dispose();
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseGlobalModuleField(Module* module) {
  WABT_TRACE(ParseGlobalModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Global);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Global));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<GlobalImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseGlobalType(&import->global));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<GlobalModuleField>(loc, name);
    CHECK_RESULT(ParseGlobalType(&field->global));
    CHECK_RESULT(ParseTerminatingInstrList(&field->global.init_expr));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->globals.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}